

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrohash64.cpp
# Opt level: O1

void MetroHash64::Hash(uint8_t *buffer,uint64_t length,uint8_t *hash,uint64_t seed)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  pauVar1 = (undefined1 (*) [16])(buffer + length);
  uVar6 = seed * 0xd6d018f5 + 0x52bc33fedbe4cbb5;
  if (0x1f < length) {
    auVar10 = vpbroadcastq_avx512vl();
    auVar3 = vpmovzxdq_avx(ZEXT816(0xa2aa033bd6d018f5));
    auVar2 = vpmovsxdq_avx(ZEXT816(0x30bc5b2962992fc1));
    auVar12 = auVar10;
    do {
      auVar11 = vpmullq_avx512vl(auVar3,*(undefined1 (*) [16])buffer);
      auVar12 = vpaddq_avx(auVar11,auVar12);
      auVar11 = vpmullq_avx512vl(auVar2,*(undefined1 (*) [16])((long)buffer + 0x10));
      buffer = (uint8_t *)((long)buffer + 0x20);
      auVar12 = vprolq_avx512vl(auVar12,0x23);
      auVar12 = vpaddq_avx(auVar12,auVar10);
      auVar10 = vpaddq_avx(auVar11,auVar10);
      auVar10 = vprolq_avx512vl(auVar10,0x23);
      auVar10 = vpaddq_avx(auVar10,auVar12);
    } while (buffer <= pauVar1 + -2);
    uVar7 = vpextrq_avx(auVar10,1);
    uVar8 = auVar12._0_8_;
    uVar5 = vpextrq_avx(auVar12,1);
    uVar4 = (uVar7 + uVar8) * 0xd6d018f5 + uVar5;
    uVar9 = auVar10._0_8_ ^ (uVar4 >> 0x25 | uVar4 * 0x8000000) * 0xa2aa033b;
    uVar4 = (uVar9 + uVar5) * 0xa2aa033b + uVar8;
    uVar7 = (uVar4 >> 0x25 | uVar4 * 0x8000000) * 0xd6d018f5 ^ uVar7;
    uVar4 = (uVar9 + uVar8) * 0xd6d018f5 + uVar7;
    uVar9 = (uVar7 + uVar5) * 0xa2aa033b + uVar9;
    uVar6 = uVar6 + ((uVar4 >> 0x25 | uVar4 * 0x8000000) * 0xa2aa033b ^ uVar8 ^ uVar5 ^
                    (uVar9 >> 0x25 | uVar9 * 0x8000000) * 0xd6d018f5);
  }
  if (0xf < (long)pauVar1 - (long)buffer) {
    uVar7 = *(long *)*(undefined1 (*) [16])buffer * 0x62992fc1 + uVar6;
    uVar4 = uVar7 >> 0x1d;
    uVar9 = uVar4 | uVar7 << 0x23;
    uVar5 = *(long *)(*(undefined1 (*) [16])buffer + 8) * 0x62992fc1 + uVar6;
    buffer = (uint8_t *)((long)buffer + 0x10);
    uVar7 = uVar5 >> 0x1d;
    uVar8 = uVar7 | uVar5 << 0x23;
    uVar5 = uVar8 * 0x30bc5b29;
    uVar6 = uVar6 + ((uVar7 * 0x7164880000000000 | uVar8 * 0x9472cc564ae2c91 >> 0x15) +
                     ((uVar4 * -0x74e180000000000 | uVar9 * 0x28e511fea41f163d >> 0x15) + uVar5 ^
                     uVar9 * 0x30bc5b29) ^ uVar5);
  }
  if (7 < (long)pauVar1 - (long)buffer) {
    uVar6 = *(long *)*(undefined1 (*) [16])buffer * 0x30bc5b29 + uVar6;
    buffer = *(undefined1 (*) [16])buffer + 8;
    uVar6 = (uVar6 >> 0x37 | uVar6 * 0x200) * 0xa2aa033b ^ uVar6;
  }
  if (3 < (long)pauVar1 - (long)buffer) {
    uVar6 = (ulong)*(uint *)*(undefined1 (*) [16])buffer * 0x30bc5b29 + uVar6;
    buffer = *(undefined1 (*) [16])buffer + 4;
    uVar6 = (uVar6 >> 0x1a | uVar6 << 0x26) * 0xa2aa033b ^ uVar6;
  }
  if (1 < (long)pauVar1 - (long)buffer) {
    uVar6 = (ulong)*(ushort *)*(undefined1 (*) [16])buffer * 0x30bc5b29 + uVar6;
    buffer = *(undefined1 (*) [16])buffer + 2;
    uVar6 = (uVar6 >> 0x30 | uVar6 * 0x10000) * 0xa2aa033b ^ uVar6;
  }
  if (pauVar1 != (undefined1 (*) [16])buffer && -1 < (long)pauVar1 - (long)buffer) {
    uVar6 = (ulong)(byte)(*(undefined1 (*) [16])buffer)[0] * 0x30bc5b29 + uVar6;
    uVar6 = (uVar6 >> 0x25 | uVar6 * 0x8000000) * 0xa2aa033b ^ uVar6;
  }
  uVar6 = (uVar6 >> 0x1c | uVar6 << 0x24) ^ uVar6;
  uVar4 = uVar6 * 0xd6d018f5;
  *(ulong *)hash = (uVar6 * -0x497f385800000000 | uVar4 >> 0x1d) ^ uVar4;
  return;
}

Assistant:

void MetroHash64::Hash(const uint8_t * buffer, const uint64_t length, uint8_t * const hash, const uint64_t seed)
{
    const uint8_t * ptr = reinterpret_cast<const uint8_t*>(buffer);
    const uint8_t * const end = ptr + length;

    uint64_t h = (static_cast<uint64_t>(seed) + k2) * k0;

    if (length >= 32)
    {
        uint64_t v[4];
        v[0] = h;
        v[1] = h;
        v[2] = h;
        v[3] = h;

        do
        {
            v[0] += read_u64(ptr) * k0; ptr += 8; v[0] = rotate_right(v[0],29) + v[2];
            v[1] += read_u64(ptr) * k1; ptr += 8; v[1] = rotate_right(v[1],29) + v[3];
            v[2] += read_u64(ptr) * k2; ptr += 8; v[2] = rotate_right(v[2],29) + v[0];
            v[3] += read_u64(ptr) * k3; ptr += 8; v[3] = rotate_right(v[3],29) + v[1];
        }
        while (ptr <= (end - 32));

        v[2] ^= rotate_right(((v[0] + v[3]) * k0) + v[1], 37) * k1;
        v[3] ^= rotate_right(((v[1] + v[2]) * k1) + v[0], 37) * k0;
        v[0] ^= rotate_right(((v[0] + v[2]) * k0) + v[3], 37) * k1;
        v[1] ^= rotate_right(((v[1] + v[3]) * k1) + v[2], 37) * k0;
        h += v[0] ^ v[1];
    }

    if ((end - ptr) >= 16)
    {
        uint64_t v0 = h + (read_u64(ptr) * k2); ptr += 8; v0 = rotate_right(v0,29) * k3;
        uint64_t v1 = h + (read_u64(ptr) * k2); ptr += 8; v1 = rotate_right(v1,29) * k3;
        v0 ^= rotate_right(v0 * k0, 21) + v1;
        v1 ^= rotate_right(v1 * k3, 21) + v0;
        h += v1;
    }

    if ((end - ptr) >= 8)
    {
        h += read_u64(ptr) * k3; ptr += 8;
        h ^= rotate_right(h, 55) * k1;
    }

    if ((end - ptr) >= 4)
    {
        h += read_u32(ptr) * k3; ptr += 4;
        h ^= rotate_right(h, 26) * k1;
    }

    if ((end - ptr) >= 2)
    {
        h += read_u16(ptr) * k3; ptr += 2;
        h ^= rotate_right(h, 48) * k1;
    }

    if ((end - ptr) >= 1)
    {
        h += read_u8 (ptr) * k3;
        h ^= rotate_right(h, 37) * k1;
    }

    h ^= rotate_right(h, 28);
    h *= k0;
    h ^= rotate_right(h, 29);

    memcpy(hash, &h, 8);
}